

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::wakeup(EventLoop *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  LogStream *pLVar5;
  char **ppcVar6;
  uint v;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_fe8;
  undefined8 local_18;
  uint64_t one;
  
  local_18 = 1;
  sVar4 = write(this->m_wakeupFd,&local_18,8);
  v = (uint)sVar4;
  if ((int)v < 1) {
    if (v == 0) {
      file_01._8_8_ = 0xd;
      file_01.m_data = "EventLoop.cpp";
      Logger::Logger(&local_fe8,file_01,0xff,ERROR);
      if (0x2a < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur))
      {
        builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,
                        "EventLoop::wakeup() send return equal zero",0x2a);
        local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x2a;
      }
    }
    else {
      iVar3 = sz_getlasterr();
      if (iVar3 == 4) {
        return;
      }
      bVar2 = sockets::sz_wouldblock();
      if (bVar2) {
        return;
      }
      file_00._8_8_ = 0xd;
      file_00.m_data = "EventLoop.cpp";
      Logger::Logger(&local_fe8,file_00,0x10a,ERROR);
      if ((((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur & 0xffffffe0U)
          != 0) {
        builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"EventLoop::wakeup() send error ",
                        0x1f);
        local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x1f;
      }
      iVar3 = sz_getlasterr();
      LogStream::operator<<(&local_fe8.m_impl.m_stream,iVar3);
    }
  }
  else {
    if ((v & 0x7fffffff) == 8) {
      return;
    }
    file._8_8_ = 0xd;
    file.m_data = "EventLoop.cpp";
    Logger::Logger(&local_fe8,file,0xf9,ERROR);
    if (0x1b < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"EventLoop::wakeup() writes ",0x1b);
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x1b;
    }
    pLVar5 = LogStream::operator<<(&local_fe8.m_impl.m_stream,v);
    ppcVar6 = &(pLVar5->m_buffer).m_cur;
    pcVar1 = (pLVar5->m_buffer).m_cur;
    if (0x13 < (uint)((int)ppcVar6 - (int)pcVar1)) {
      builtin_strncpy(pcVar1," bytes instead of 8",0x13);
      *ppcVar6 = *ppcVar6 + 0x13;
    }
  }
  Logger::~Logger(&local_fe8);
  return;
}

Assistant:

void EventLoop::wakeup()
{
	uint64_t one = 1;
	int n = 0;
#if defined(SZ_OS_WINDOWS)
	n = ::send(m_wakeupFd.event_write, reinterpret_cast<const char*>(&one), sizeof(one), 0);
#else
	n = ::write(m_wakeupFd, &one, sizeof(one));
#endif
	if (n > 0) 
	{
		if (n != sizeof(one))
		{
			LOG_ERROR << "EventLoop::wakeup() writes " << n << " bytes instead of 8";
		}
		return;
	}
	else if (n == 0) 
	{
		LOG_ERROR << "EventLoop::wakeup() send return equal zero";
	}
	else 
	{
		if (sz_getlasterr() == sz_err_eintr || sockets::sz_wouldblock())
		{
			//LOG_WARN << "EventLoop::wakeup() send sz_getlasterr() rst " 
			//	<< sz_getlasterr() 
			//	<< " is sz_err_eintr or sockets::sz_wouldblock()";
			return;
		}
		LOG_ERROR << "EventLoop::wakeup() send error " << sz_getlasterr();
	}
}